

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeval.c
# Opt level: O0

timediff_t Curl_timediff(curltime newer,curltime older)

{
  long lVar1;
  timediff_t diff;
  curltime older_local;
  curltime newer_local;
  
  lVar1 = newer.tv_sec - older.tv_sec;
  if (lVar1 < 0x20c49ba5e353f7) {
    if (lVar1 < -0x20c49ba5e353f6) {
      newer_local.tv_usec = 0;
      newer_local._12_4_ = 0x80000000;
    }
    else {
      newer_local._8_8_ = lVar1 * 1000 + (long)((newer.tv_usec - older.tv_usec) / 1000);
    }
  }
  else {
    newer_local.tv_usec = -1;
    newer_local._12_4_ = 0x7fffffff;
  }
  return newer_local._8_8_;
}

Assistant:

timediff_t Curl_timediff(struct curltime newer, struct curltime older)
{
  timediff_t diff = (timediff_t)newer.tv_sec-older.tv_sec;
  if(diff >= (TIMEDIFF_T_MAX/1000))
    return TIMEDIFF_T_MAX;
  else if(diff <= (TIMEDIFF_T_MIN/1000))
    return TIMEDIFF_T_MIN;
  return diff * 1000 + (newer.tv_usec-older.tv_usec)/1000;
}